

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

void ptls_minicrypto_random_bytes(void *buf,size_t len)

{
  uint32_t uVar1;
  long *in_FS_OFFSET;
  uint8_t local_118 [8];
  uint8_t entropy [256];
  size_t len_local;
  void *buf_local;
  
  entropy._248_8_ = len;
  uVar1 = cf_hash_drbg_sha256_needs_reseed((cf_hash_drbg_sha256 *)(*in_FS_OFFSET + -0x74));
  if (uVar1 != 0) {
    read_entropy(local_118,0x100);
    cf_hash_drbg_sha256_init
              ((cf_hash_drbg_sha256 *)(*in_FS_OFFSET + -0x74),local_118,0x80,entropy + 0x78,0x80,
               "ptls",4);
  }
  cf_hash_drbg_sha256_gen((cf_hash_drbg_sha256 *)(*in_FS_OFFSET + -0x74),buf,entropy._248_8_);
  return;
}

Assistant:

void ptls_minicrypto_random_bytes(void *buf, size_t len)
{
#ifdef _WINDOWS
    static __declspec(thread) cf_hash_drbg_sha256 ctx;
#else
    static __thread cf_hash_drbg_sha256 ctx;
#endif

    if (cf_hash_drbg_sha256_needs_reseed(&ctx)) {
        uint8_t entropy[256];
        read_entropy(entropy, sizeof(entropy));
        cf_hash_drbg_sha256_init(&ctx, entropy, sizeof(entropy) / 2, entropy + sizeof(entropy) / 2, sizeof(entropy) / 2, "ptls", 4);
    }
    cf_hash_drbg_sha256_gen(&ctx, buf, len);
}